

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int spawn_tcp_server_helper(void)

{
  int iVar1;
  undefined8 uVar2;
  int extraout_EDX;
  uv_process_options_t *unaff_RBX;
  uv_process_options_t *puVar3;
  long *plVar4;
  long *plVar5;
  undefined1 **ppuVar6;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t tcp;
  undefined1 *puStack_1c0;
  uv_process_options_t *puStack_1b8;
  undefined8 uStack_1b0;
  long lStack_1a0;
  long lStack_198;
  uv_process_options_t *puStack_190;
  long lStack_180;
  long lStack_178;
  uv_process_options_t *puStack_170;
  undefined4 uStack_144;
  uv_stdio_container_t uStack_140;
  undefined4 uStack_130;
  undefined4 uStack_128;
  undefined4 uStack_120;
  undefined4 uStack_118;
  undefined4 uStack_110;
  undefined4 uStack_108;
  undefined1 auStack_100 [16];
  undefined1 local_d8 [216];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,local_d8);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_open(local_d8,3);
    if (iVar1 != 0) goto LAB_001c05d3;
    iVar1 = uv_listen(local_d8,0x1000,0);
    if (iVar1 == 0) {
      return 1;
    }
  }
  else {
    spawn_tcp_server_helper_cold_1();
LAB_001c05d3:
    spawn_tcp_server_helper_cold_2();
  }
  spawn_tcp_server_helper_cold_3();
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_100);
  uStack_140._0_8_ = SEXT48(iVar1);
  if (uStack_140._0_8_ == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init_ex(uVar2,&tcp_server,2);
    uStack_140._0_8_ = SEXT48(iVar1);
    if (uStack_140._0_8_ != 0) goto LAB_001c0839;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_100,0);
    uStack_140._0_8_ = SEXT48(iVar1);
    if (uStack_140._0_8_ != 0) goto LAB_001c0848;
    iVar1 = uv_fileno(&tcp_server,&uStack_144);
    uStack_140._0_8_ = SEXT48(iVar1);
    if (uStack_140._0_8_ != 0) goto LAB_001c0857;
    options.stdio = &uStack_140;
    unaff_RBX = &options;
    uStack_140._4_4_ = iVar1 >> 0x1f;
    uStack_140.flags = 2;
    uStack_140.data.file = 0;
    uStack_130 = 2;
    uStack_128 = 1;
    uStack_120 = 2;
    uStack_118 = 2;
    uStack_110 = 2;
    uStack_108 = uStack_144;
    options.stdio_count = 4;
    uVar2 = uv_default_loop();
    iVar1 = uv_spawn(uVar2,&process,&options);
    if (iVar1 != 0) goto LAB_001c0866;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_001c0875;
    if (exit_cb_called != 1) goto LAB_001c0884;
    if (close_cb_called != 1) goto LAB_001c0893;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_001c0839:
    run_test_spawn_tcp_server_cold_2();
LAB_001c0848:
    run_test_spawn_tcp_server_cold_3();
LAB_001c0857:
    run_test_spawn_tcp_server_cold_4();
LAB_001c0866:
    run_test_spawn_tcp_server_cold_5();
LAB_001c0875:
    run_test_spawn_tcp_server_cold_6();
LAB_001c0884:
    run_test_spawn_tcp_server_cold_7();
LAB_001c0893:
    run_test_spawn_tcp_server_cold_8();
  }
  run_test_spawn_tcp_server_cold_9();
  puStack_190 = (uv_process_options_t *)0x1c08cb;
  puStack_170 = unaff_RBX;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar3 = &options;
  options.stdio_count = 0;
  puStack_190 = (uv_process_options_t *)0x1c08eb;
  uVar2 = uv_default_loop();
  puStack_190 = (uv_process_options_t *)0x1c08fd;
  iVar1 = uv_spawn(uVar2,&process,&options);
  lStack_178 = (long)iVar1;
  lStack_180 = 0;
  if (lStack_178 == 0) {
    puStack_190 = (uv_process_options_t *)0x1c091e;
    uVar2 = uv_default_loop();
    puStack_190 = (uv_process_options_t *)0x1c0928;
    iVar1 = uv_run(uVar2,0);
    lStack_178 = (long)iVar1;
    lStack_180 = 0;
    if (lStack_178 != 0) goto LAB_001c09fc;
    lStack_178 = 1;
    lStack_180 = (long)exit_cb_called;
    if (lStack_180 != 1) goto LAB_001c0a0b;
    lStack_178 = 1;
    lStack_180 = (long)close_cb_called;
    if (lStack_180 != 1) goto LAB_001c0a1a;
    puStack_190 = (uv_process_options_t *)0x1c0997;
    puVar3 = (uv_process_options_t *)uv_default_loop();
    puStack_190 = (uv_process_options_t *)0x1c09ab;
    uv_walk(puVar3,close_walk_cb,0);
    puStack_190 = (uv_process_options_t *)0x1c09b5;
    uv_run(puVar3,0);
    lStack_178 = 0;
    puStack_190 = (uv_process_options_t *)0x1c09c3;
    uVar2 = uv_default_loop();
    puStack_190 = (uv_process_options_t *)0x1c09cb;
    iVar1 = uv_loop_close(uVar2);
    lStack_180 = (long)iVar1;
    if (lStack_178 == lStack_180) {
      puStack_190 = (uv_process_options_t *)0x1c09e3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_190 = (uv_process_options_t *)0x1c09fc;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001c09fc:
    puStack_190 = (uv_process_options_t *)0x1c0a0b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001c0a0b:
    puStack_190 = (uv_process_options_t *)0x1c0a1a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001c0a1a:
    puStack_190 = (uv_process_options_t *)0x1c0a29;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStack_190 = (uv_process_options_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  plVar4 = &lStack_1a0;
  puStack_190 = puVar3;
  init_process_options("spawn_helper4",kill_cb);
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  lStack_198 = (long)iVar1;
  lStack_1a0 = 0;
  if (lStack_198 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,&timer);
    lStack_198 = (long)iVar1;
    lStack_1a0 = 0;
    if (lStack_198 != 0) goto LAB_001c0bca;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    lStack_198 = (long)iVar1;
    lStack_1a0 = 0;
    if (lStack_198 != 0) goto LAB_001c0bd7;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    lStack_198 = (long)iVar1;
    lStack_1a0 = 0;
    if (lStack_198 != 0) goto LAB_001c0be4;
    lStack_198 = 1;
    lStack_1a0 = (long)exit_cb_called;
    if (lStack_1a0 != 1) goto LAB_001c0bf1;
    lStack_198 = 2;
    lStack_1a0 = (long)close_cb_called;
    if (lStack_1a0 != 2) goto LAB_001c0bfe;
    puVar3 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar3,close_walk_cb,0);
    uv_run(puVar3,0);
    lStack_198 = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    lStack_1a0 = (long)iVar1;
    if (lStack_198 == lStack_1a0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
LAB_001c0bca:
    run_test_spawn_and_kill_cold_2();
LAB_001c0bd7:
    run_test_spawn_and_kill_cold_3();
LAB_001c0be4:
    run_test_spawn_and_kill_cold_4();
LAB_001c0bf1:
    run_test_spawn_and_kill_cold_5();
LAB_001c0bfe:
    run_test_spawn_and_kill_cold_6();
  }
  plVar5 = &lStack_198;
  run_test_spawn_and_kill_cold_7();
  uStack_1b0 = 0;
  puStack_1b8 = puVar3;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  puStack_1c0 = (undefined1 *)plVar4;
  if (plVar4 == (long *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001c0cb9;
    uv_close(plVar5,close_cb);
    puStack_1c0 = (undefined1 *)(long)(int)plVar5[9];
    if (puStack_1c0 != (undefined1 *)0x0) {
      iVar1 = uv_kill(puStack_1c0,0);
      puStack_1c0 = (undefined1 *)(long)iVar1;
      if (puStack_1c0 == (undefined1 *)0xfffffffffffffffd) {
        return iVar1;
      }
      goto LAB_001c0ccb;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001c0cb9:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001c0ccb:
  ppuVar6 = &puStack_1c0;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar1 = uv_close(ppuVar6,close_cb);
  return iVar1;
}

Assistant:

int spawn_tcp_server_helper(void) {
  uv_tcp_t tcp;
  uv_os_sock_t handle;
  int r;

  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT_OK(r);

#ifdef _WIN32
  handle = _get_osfhandle(3);
#else
  handle = 3;
#endif
  r = uv_tcp_open(&tcp, handle);
  ASSERT_OK(r);

  /* Make sure that we can listen on a socket that was
   * passed down from the parent process
   */
  r = uv_listen((uv_stream_t*) &tcp, SOMAXCONN, NULL);
  ASSERT_OK(r);

  return 1;
}